

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# views_pool.cpp
# Opt level: O2

string * __thiscall
cppcms::views::generator::name_abi_cxx11_(string *__return_storage_ptr__,generator *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

std::string generator::name() const
{
	return name_;
}